

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

char __thiscall QJsonPrivate::Parser::nextToken(Parser *this)

{
  char *pcVar1;
  bool bVar2;
  Parser *in_RDI;
  char token;
  char local_11;
  char local_1;
  
  bVar2 = eatSpace(in_RDI);
  if (bVar2) {
    pcVar1 = in_RDI->json;
    in_RDI->json = pcVar1 + 1;
    local_11 = *pcVar1;
    if ((((local_11 != '\"') && (local_11 != ',')) && (local_11 != ':')) &&
       (((local_11 != '[' && (local_11 != ']')) && ((local_11 != '{' && (local_11 != '}')))))) {
      local_11 = '\0';
    }
    local_1 = local_11;
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

char Parser::nextToken()
{
    if (!eatSpace())
        return 0;
    char token = *json++;
    switch (token) {
    case BeginArray:
    case BeginObject:
    case NameSeparator:
    case ValueSeparator:
    case EndArray:
    case EndObject:
    case Quote:
        break;
    default:
        token = 0;
        break;
    }
    return token;
}